

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgamma.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  undefined8 uVar3;
  double dVar4;
  char local_470 [8];
  SDL_Event event;
  SDL_Rect dst;
  Uint32 timeout;
  Uint32 then;
  Uint16 red_ramp [256];
  Uint16 ramp [256];
  uint local_40;
  int local_3c;
  Uint32 flags;
  int bpp;
  int h;
  int w;
  int i;
  float gamma;
  SDL_Surface *image;
  SDL_Surface *screen;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  screen = (SDL_Surface *)argv;
  argv_local._0_4_ = argc;
  iVar2 = get_video_args(argv,&bpp,(int *)&flags,&local_3c,&local_40);
  screen = (SDL_Surface *)(&screen->flags + (long)iVar2 * 2);
  iVar2 = SDL_Init(0x20);
  pFVar1 = _stderr;
  if (iVar2 < 0) {
    uVar3 = SDL_GetError();
    fprintf(pFVar1,"Couldn\'t initialize SDL: %s\n",uVar3);
    argv_local._4_4_ = 1;
  }
  else {
    image = (SDL_Surface *)SDL_SetVideoMode(bpp,flags,local_3c,local_40 | 0x20000000);
    pFVar1 = _stderr;
    if (image == (SDL_Surface *)0x0) {
      uVar3 = SDL_GetError();
      fprintf(pFVar1,"Couldn\'t set %dx%d video mode: %s\n",(ulong)(uint)bpp,(ulong)flags,uVar3);
      quit(1);
    }
    SDL_WM_SetCaption("SDL gamma test","testgamma");
    w = 0x3f800000;
    if (*(long *)screen != 0) {
      dVar4 = atof(*(char **)screen);
      w = (int)(float)dVar4;
    }
    iVar2 = SDL_SetGamma(w,w,w);
    pFVar1 = _stderr;
    if (iVar2 < 0) {
      uVar3 = SDL_GetError();
      fprintf(pFVar1,"Unable to set gamma: %s\n",uVar3);
      quit(1);
    }
    uVar3 = SDL_RWFromFile("sample.bmp","rb");
    _i = __libc_start_main(uVar3,1);
    if (_i != 0) {
      event.key.keysym.unicode = (Uint16)((image->w - *(int *)(_i + 0x10)) / 2);
      event._18_2_ = (undefined2)((image->h - *(int *)(_i + 0x14)) / 2);
      event._20_2_ = (undefined2)*(undefined4 *)(_i + 0x10);
      event._22_2_ = (undefined2)*(undefined4 *)(_i + 0x14);
      SDL_UpperBlit(_i,0,image,&event.key.keysym.unicode);
      SDL_UpdateRects(image,1,&event.key.keysym.unicode);
    }
    dst._4_4_ = SDL_GetTicks();
    dst.x = 5000;
    dst.y = 0;
    while (iVar2 = SDL_GetTicks(), (uint)(iVar2 - dst._4_4_) < (uint)dst._0_4_) {
      while (iVar2 = SDL_PollEvent(local_470), iVar2 != 0) {
        if (local_470[0] == '\x02') {
          if (event.jhat == (SDL_JoyHatEvent)0x1b) {
            dst.x = 0;
            dst.y = 0;
          }
          else if (event.jhat == (SDL_JoyHatEvent)0x20) {
            dst._0_4_ = dst._0_4_ + 5000;
          }
          else if (event.jhat == (SDL_JoyHatEvent)0x111) {
            w = (int)((float)w + 0.2);
            SDL_SetGamma(w,w,w);
          }
          else if (event.jhat == (SDL_JoyHatEvent)0x112) {
            w = (int)((float)w - 0.2);
            SDL_SetGamma(w,w,w);
          }
        }
        else if (local_470[0] == '\f') {
          dst.x = 0;
          dst.y = 0;
        }
      }
    }
    while ((float)w < 10.0) {
      w = (int)((float)w + 0.1);
      CalculateGamma((double)(float)w,(Uint16 *)&timeout);
      CalculateGamma(1.0 / (double)(float)w,red_ramp + 0xfc);
      SDL_SetGammaRamp(&timeout,red_ramp + 0xfc,red_ramp + 0xfc);
    }
    memset(&timeout,0xff,0x200);
    memset(red_ramp + 0xfc,0,0x200);
    SDL_SetGammaRamp(&timeout,red_ramp + 0xfc,red_ramp + 0xfc);
    for (h = (int)(uint)(ushort)timeout >> 8; -1 < h; h = h + -1) {
      memset(&timeout,h & 0xff,0x200);
      SDL_SetGammaRamp(&timeout,0);
    }
    SDL_Delay(1000);
    SDL_Quit();
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	SDL_Surface *screen;
	SDL_Surface *image;
	float gamma;
	int i;
	int w, h, bpp;
	Uint32 flags;
	Uint16 ramp[256];
	Uint16 red_ramp[256];
	Uint32 then, timeout;

	/* Check command line arguments */
	argv += get_video_args(argv, &w, &h, &bpp, &flags);

	/* Initialize SDL */
	if ( SDL_Init(SDL_INIT_VIDEO) < 0 ) {
		fprintf(stderr,
			"Couldn't initialize SDL: %s\n", SDL_GetError());
		return(1);
	}

	/* Initialize the display, always use hardware palette */
	screen = SDL_SetVideoMode(w, h, bpp, flags | SDL_HWPALETTE);
	if ( screen == NULL ) {
		fprintf(stderr, "Couldn't set %dx%d video mode: %s\n",
						w, h, SDL_GetError());
		quit(1);
	}

	/* Set the window manager title bar */
	SDL_WM_SetCaption("SDL gamma test", "testgamma");

	/* Set the desired gamma, if any */
	gamma = 1.0f;
	if ( *argv ) {
		gamma = (float)atof(*argv);
	}
	if ( SDL_SetGamma(gamma, gamma, gamma) < 0 ) {
		fprintf(stderr, "Unable to set gamma: %s\n", SDL_GetError());
		quit(1);
	}

#if 0 /* This isn't supported.  Integrating the gamma ramps isn't exact */
	/* See what gamma was actually set */
	float real[3];
	if ( SDL_GetGamma(&real[0], &real[1], &real[2]) < 0 ) {
		printf("Couldn't get gamma: %s\n", SDL_GetError());
	} else {
		printf("Set gamma values: R=%2.2f, G=%2.2f, B=%2.2f\n",
			real[0], real[1], real[2]);
	}
#endif

	/* Do all the drawing work */
	image = SDL_LoadBMP("sample.bmp");
	if ( image ) {
		SDL_Rect dst;

		dst.x = (screen->w - image->w)/2;
		dst.y = (screen->h - image->h)/2;
		dst.w = image->w;
		dst.h = image->h;
		SDL_BlitSurface(image, NULL, screen, &dst);
		SDL_UpdateRects(screen, 1, &dst);
	}

	/* Wait a bit, handling events */
	then = SDL_GetTicks();
	timeout = (5*1000);
	while ( (SDL_GetTicks()-then) < timeout ) {
		SDL_Event event;

		while ( SDL_PollEvent(&event) ) {
			switch (event.type) {
			    case SDL_QUIT:	/* Quit now */
				timeout = 0;
				break;
			    case SDL_KEYDOWN:
				switch (event.key.keysym.sym) {
				    case SDLK_SPACE:	/* Go longer.. */
					timeout += (5*1000);
					break;
				    case SDLK_UP:
					gamma += 0.2f;
					SDL_SetGamma(gamma, gamma, gamma);
					break;
				    case SDLK_DOWN:
					gamma -= 0.2f;
					SDL_SetGamma(gamma, gamma, gamma);
					break;
				    case SDLK_ESCAPE:
					timeout = 0;
					break;
				    default:
					break;
				}
				break;
			}
		}
	}

	/* Perform a gamma flash to red using color ramps */
	while ( gamma < 10.0 ) {
		/* Increase the red gamma and decrease everything else... */
		gamma += 0.1f;
		CalculateGamma(gamma, red_ramp);
		CalculateGamma(1.0/gamma, ramp);
		SDL_SetGammaRamp(red_ramp, ramp, ramp);
	}
	/* Finish completely red */
	memset(red_ramp, 255, sizeof(red_ramp));
	memset(ramp, 0, sizeof(ramp));
	SDL_SetGammaRamp(red_ramp, ramp, ramp);

	/* Now fade out to black */
	for ( i=(red_ramp[0] >> 8); i >= 0; --i ) {
		memset(red_ramp, i, sizeof(red_ramp));
		SDL_SetGammaRamp(red_ramp, NULL, NULL);
	}
	SDL_Delay(1*1000);

	SDL_Quit();
	return(0);
}